

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  xmlChar *pxVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  
  pxVar3 = ctxt->state;
  ppxVar1 = &pxVar3->value;
  iVar4 = (int)ppxVar1;
  if ((pxVar3->value != (xmlChar *)0x0) && (pxVar3->endvalue != (xmlChar *)0x0)) {
    pxVar5 = pxVar3->value + -1;
    do {
      pxVar2 = pxVar5 + 1;
      pxVar5 = pxVar5 + 1;
    } while (*pxVar2 != '\0');
    while( true ) {
      if (pxVar5 == pxVar3->endvalue) {
        *ppxVar1 = (xmlChar *)0x0;
        return iVar4;
      }
      if (*pxVar5 != '\0') break;
      pxVar5 = pxVar5 + 1;
    }
    *ppxVar1 = pxVar5;
    return iVar4;
  }
  *ppxVar1 = (xmlChar *)0x0;
  pxVar3->endvalue = (xmlChar *)0x0;
  return iVar4;
}

Assistant:

static int
xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlChar *cur;

    cur = ctxt->state->value;
    if ((cur == NULL) || (ctxt->state->endvalue == NULL)) {
        ctxt->state->value = NULL;
        ctxt->state->endvalue = NULL;
        return (0);
    }
    while (*cur != 0)
        cur++;
    while ((cur != ctxt->state->endvalue) && (*cur == 0))
        cur++;
    if (cur == ctxt->state->endvalue)
        ctxt->state->value = NULL;
    else
        ctxt->state->value = cur;
    return (0);
}